

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O1

bool __thiscall
QWidgetLineControl::finishChange
          (QWidgetLineControl *this,int validateFromState,bool update,bool edited)

{
  ushort uVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QStringView QVar8;
  int cursorCopy;
  QString local_58;
  void *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(ushort *)(this + 0x50);
  if ((uVar1 & 0x40) != 0) {
    *(ushort *)(this + 0x50) = uVar1 | 0x100;
    if (((*(long *)(this + 0xa8) == 0) || (*(int *)(*(long *)(this + 0xa8) + 4) == 0)) ||
       (*(long *)(this + 0xb0) == 0)) {
LAB_0042adaa:
      if ((-1 < validateFromState && (uVar1 >> 8 & 1) != 0) && (((byte)this[0x51] & 1) == 0)) {
        if (*(long *)(this + 0x78) != 0) {
          bVar2 = false;
          bVar4 = false;
          goto LAB_0042af12;
        }
        internalUndo(this,validateFromState);
        lVar6 = (long)*(int *)(this + 0xf4) * 0x10 + *(long *)(this + 0xf8);
        if ((lVar6 != *(long *)(this + 0x100)) &&
           (lVar6 = lVar6 + (*(long *)(this + 0x100) - *(long *)(this + 0x100)),
           *(long *)(this + 0x100) != lVar6)) {
          *(long *)(this + 0x100) = lVar6;
        }
        if (*(int *)(this + 0xf4) < *(int *)(this + 0xf0)) {
          *(undefined4 *)(this + 0xf0) = 0xffffffff;
        }
        *(ushort *)(this + 0x50) = (ushort)*(undefined4 *)(this + 0x50) & 0xfebf | 0x100;
      }
      updateDisplayText(this,false);
      bVar2 = true;
      if ((*(ushort *)(this + 0x50) & 0x40) != 0) {
        *(ushort *)(this + 0x50) = *(ushort *)(this + 0x50) & 0xffbf;
        local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        text(&local_58,this);
        if (edited) {
          local_38 = (void *)0x0;
          puStack_30 = (undefined1 *)&local_58;
          QMetaObject::activate((QObject *)this,&staticMetaObject,4,&local_38);
        }
        local_38 = (void *)0x0;
        puStack_30 = (undefined1 *)&local_58;
        QMetaObject::activate((QObject *)this,&staticMetaObject,3,&local_38);
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      bVar4 = true;
    }
    else {
      local_58.d.d = *(Data **)(this + 0x18);
      local_58.d.ptr = *(char16_t **)(this + 0x20);
      local_58.d.size = *(qsizetype *)(this + 0x28);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_38 = (void *)CONCAT44(local_38._4_4_,*(undefined4 *)(this + 0x40));
      iVar5 = (**(code **)(**(long **)(this + 0xb0) + 0x60))(*(long **)(this + 0xb0),&local_58);
      *(ushort *)(this + 0x50) =
           (ushort)*(undefined4 *)(this + 0x50) & 0xfeff | (ushort)(iVar5 != 0) << 8;
      if (iVar5 == 0) {
        QMetaObject::activate((QObject *)this,&staticMetaObject,10,(void **)0x0);
LAB_0042ad89:
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
        goto LAB_0042adaa;
      }
      if (*(undefined1 **)(this + 0x28) == (undefined1 *)local_58.d.size) {
        QVar7.m_data = *(storage_type_conflict **)(this + 0x20);
        QVar7.m_size = (qsizetype)*(undefined1 **)(this + 0x28);
        QVar8.m_data = local_58.d.ptr;
        QVar8.m_size = local_58.d.size;
        cVar3 = QtPrivate::equalStrings(QVar7,QVar8);
        if (cVar3 != '\0') {
          *(int *)(this + 0x40) = (int)local_38;
          goto LAB_0042ad89;
        }
      }
      internalSetText(this,&local_58,(int)local_38,edited);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      bVar4 = true;
      bVar2 = false;
    }
LAB_0042af12:
    if (!bVar2) goto LAB_0042af66;
  }
  if ((char)*(ushort *)(this + 0x50) < '\0') {
    *(ushort *)(this + 0x50) = *(ushort *)(this + 0x50) & 0xff7f;
    QMetaObject::activate((QObject *)this,&staticMetaObject,1,(void **)0x0);
  }
  if (*(int *)(this + 0x40) == *(int *)(this + 100)) {
    QMetaObject::activate((QObject *)this,&staticMetaObject,6,(void **)0x0);
  }
  emitCursorPositionChanged(this);
  bVar4 = true;
LAB_0042af66:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetLineControl::finishChange(int validateFromState, bool update, bool edited)
{
    Q_UNUSED(update);

    if (m_textDirty) {
        // do validation
        bool wasValidInput = m_validInput;
        m_validInput = true;
#ifndef QT_NO_VALIDATOR
        if (m_validator) {
            QString textCopy = m_text;
            int cursorCopy = m_cursor;
            m_validInput = (m_validator->validate(textCopy, cursorCopy) != QValidator::Invalid);
            if (m_validInput) {
                if (m_text != textCopy) {
                    internalSetText(textCopy, cursorCopy, edited);
                    return true;
                }
                m_cursor = cursorCopy;
            } else {
                emit inputRejected();
            }
        }
#endif
        if (validateFromState >= 0 && wasValidInput && !m_validInput) {
            if (m_transactions.size())
                return false;
            internalUndo(validateFromState);
            m_history.erase(m_history.begin() + m_undoState, m_history.end());
            if (m_modifiedState > m_undoState)
                m_modifiedState = -1;
            m_validInput = true;
            m_textDirty = false;
        }
        updateDisplayText();

        if (m_textDirty) {
            m_textDirty = false;
            QString actualText = text();
            if (edited)
                emit textEdited(actualText);
            emit textChanged(actualText);
        }
    }
    if (m_selDirty) {
        m_selDirty = false;
        emit selectionChanged();
    }
    if (m_cursor == m_lastCursorPos)
        emit updateMicroFocus();
    emitCursorPositionChanged();
    return true;
}